

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2_smpl.c
# Opt level: O0

int ossl_ec_GF2m_simple_group_copy(EC_GROUP *dest,EC_GROUP *src)

{
  BIGNUM *pBVar1;
  BIGNUM *pBVar2;
  long in_RSI;
  BIGNUM *in_RDI;
  int words;
  int local_4;
  
  pBVar1 = BN_copy(*(BIGNUM **)&in_RDI[2].neg,*(BIGNUM **)(in_RSI + 0x40));
  if (pBVar1 == (BIGNUM *)0x0) {
    local_4 = 0;
  }
  else {
    pBVar1 = BN_copy((BIGNUM *)in_RDI[4].d,*(BIGNUM **)(in_RSI + 0x60));
    if (pBVar1 == (BIGNUM *)0x0) {
      local_4 = 0;
    }
    else {
      pBVar1 = BN_copy(*(BIGNUM **)&in_RDI[4].top,*(BIGNUM **)(in_RSI + 0x68));
      if (pBVar1 == (BIGNUM *)0x0) {
        local_4 = 0;
      }
      else {
        *(undefined4 *)&in_RDI[3].d = *(undefined4 *)(in_RSI + 0x48);
        *(undefined4 *)((long)&in_RDI[3].d + 4) = *(undefined4 *)(in_RSI + 0x4c);
        in_RDI[3].top = *(int *)(in_RSI + 0x50);
        in_RDI[3].dmax = *(int *)(in_RSI + 0x54);
        in_RDI[3].neg = *(int *)(in_RSI + 0x58);
        in_RDI[3].flags = *(int *)(in_RSI + 0x5c);
        words = (int)((ulong)in_RSI >> 0x20);
        pBVar2 = bn_wexpand(in_RDI,words);
        if (pBVar2 == (BIGNUM *)0x0) {
          local_4 = 0;
        }
        else {
          pBVar2 = bn_wexpand(in_RDI,words);
          if (pBVar2 == (BIGNUM *)0x0) {
            local_4 = 0;
          }
          else {
            bn_set_all_zero((BIGNUM *)in_RDI[4].d);
            bn_set_all_zero(*(BIGNUM **)&in_RDI[4].top);
            local_4 = 1;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ossl_ec_GF2m_simple_group_copy(EC_GROUP *dest, const EC_GROUP *src)
{
    if (!BN_copy(dest->field, src->field))
        return 0;
    if (!BN_copy(dest->a, src->a))
        return 0;
    if (!BN_copy(dest->b, src->b))
        return 0;
    dest->poly[0] = src->poly[0];
    dest->poly[1] = src->poly[1];
    dest->poly[2] = src->poly[2];
    dest->poly[3] = src->poly[3];
    dest->poly[4] = src->poly[4];
    dest->poly[5] = src->poly[5];
    if (bn_wexpand(dest->a, (int)(dest->poly[0] + BN_BITS2 - 1) / BN_BITS2) ==
        NULL)
        return 0;
    if (bn_wexpand(dest->b, (int)(dest->poly[0] + BN_BITS2 - 1) / BN_BITS2) ==
        NULL)
        return 0;
    bn_set_all_zero(dest->a);
    bn_set_all_zero(dest->b);
    return 1;
}